

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVIMaker.cpp
# Opt level: O0

VideoStream * __thiscall AVIMaker::getVideoStreamByID(AVIMaker *this,uint32_t stream_id)

{
  size_type sVar1;
  reference ppVVar2;
  size_t sVar3;
  int local_20;
  int i;
  uint32_t stream_id_local;
  AVIMaker *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<VideoStream_*,_std::allocator<VideoStream_*>_>::size(&this->videoStreams);
    if (sVar1 <= (ulong)(long)local_20) {
      if ((this->isTrace & 1U) != 0) {
        printf("getVideoStreamByID failed. id = %d",(ulong)stream_id);
      }
      return (VideoStream *)0x0;
    }
    ppVVar2 = std::vector<VideoStream_*,_std::allocator<VideoStream_*>_>::operator[]
                        (&this->videoStreams,(long)local_20);
    sVar3 = VideoStream::getStreamID(*ppVVar2);
    if (sVar3 == stream_id) break;
    local_20 = local_20 + 1;
  }
  ppVVar2 = std::vector<VideoStream_*,_std::allocator<VideoStream_*>_>::operator[]
                      (&this->videoStreams,(long)local_20);
  return *ppVVar2;
}

Assistant:

VideoStream *AVIMaker::getVideoStreamByID(uint32_t stream_id) {
    for (int i = 0; i < this->videoStreams.size(); i++) {
        if (this->videoStreams[i]->getStreamID() == stream_id) return this->videoStreams[i];
    }
    TRACE printf("getVideoStreamByID failed. id = %d", stream_id);
    return nullptr;
}